

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O1

void __thiscall r_exec::InputLessPGMOverlay::patch_tpl_args(InputLessPGMOverlay *this)

{
  _Object *p_Var1;
  Atom *pAVar2;
  InputLessPGMOverlay *this_00;
  byte bVar3;
  ushort uVar4;
  uint16_t pgm_code_index;
  uint16_t ipgm_code_index;
  uint uVar5;
  ulong uVar6;
  Atom local_3c [4];
  InputLessPGMOverlay *local_38;
  
  r_code::Atom::asIndex();
  bVar3 = r_code::Atom::getAtomCount();
  p_Var1 = (((this->super_Overlay).controller)->view->object).object;
  local_38 = this;
  (*p_Var1->_vptr__Object[4])(p_Var1,2);
  uVar5 = r_code::Atom::asIndex();
  if (bVar3 != 0) {
    uVar6 = (ulong)bVar3;
    do {
      this_00 = local_38;
      uVar5 = uVar5 + 1;
      pAVar2 = (local_38->super_Overlay).code;
      uVar4 = r_code::Atom::asIndex();
      pgm_code_index = r_code::Atom::asIndex();
      p_Var1 = (((this_00->super_Overlay).controller)->view->object).object;
      (*p_Var1->_vptr__Object[4])(p_Var1,(ulong)(uVar5 & 0xffff));
      ipgm_code_index = r_code::Atom::asIndex();
      patch_tpl_code(this_00,pgm_code_index,ipgm_code_index);
      r_code::Atom::IPGMPointer((ushort)local_3c);
      r_code::Atom::operator=(pAVar2 + (ulong)uVar4 * 4 + 4,local_3c);
      r_code::Atom::~Atom(local_3c);
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

void InputLessPGMOverlay::patch_tpl_args()   // no rollback on that part of the code.
{
    //getObject()->trace();
    uint16_t tpl_arg_set_index = code[PGM_TPL_ARGS].asIndex(); // index to the set of all tpl patterns.
    uint16_t arg_count = code[tpl_arg_set_index].getAtomCount();
    uint16_t ipgm_arg_set_index = getObject()->code(IPGM_ARGS).asIndex(); // index to the set of all ipgm tpl args.

    for (uint16_t i = 1; i <= arg_count; ++i) { // pgm_code[tpl_arg_set_index+i] is an iptr to a pattern.
        Atom &skel_iptr = code[code[tpl_arg_set_index + i].asIndex() + 1];
        patch_tpl_code(skel_iptr.asIndex(), getObject()->code(ipgm_arg_set_index + i).asIndex());
        skel_iptr = Atom::IPGMPointer(ipgm_arg_set_index + i); // patch the pgm code with ptrs to the tpl args' actual location in the ipgm code.
    }

    //Atom::Trace(pgm_code,getObject()->get_reference(0)->code_size());
}